

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O3

Mat3x3d * __thiscall
OpenMD::HydroProp::getPitchMatrix(Mat3x3d *__return_storage_ptr__,HydroProp *this)

{
  undefined8 *puVar1;
  double dVar2;
  undefined8 uVar3;
  long lVar4;
  double *pdVar5;
  uint i;
  uint j;
  long lVar6;
  SquareMatrix3<double> *pSVar7;
  double *pdVar8;
  uint j_1;
  double *pdVar9;
  uint k;
  long lVar10;
  byte bVar11;
  Mat3x3d Xirt;
  Mat3x3d Xitt;
  RectMatrix<double,_3U,_3U> result_1;
  RectMatrix<double,_3U,_3U> result;
  double local_1d8 [10];
  SquareMatrix3<double> local_188;
  double local_138 [18];
  double local_a8 [9];
  SquareMatrix3<double> local_60;
  
  bVar11 = 0;
  lVar4 = 0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
  [2] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
  [0] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
  [1] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
  [1] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
  [2] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
  [2] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
  [0] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
  [0] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
  [1] = 0.0;
  local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  do {
    *(undefined8 *)
     ((long)local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar4 + 0x10) =
         *(undefined8 *)
          ((long)(this->Xi_).super_RectMatrix<double,_6U,_6U>.data_[0] + lVar4 * 2 + 0x10);
    puVar1 = (undefined8 *)((long)(this->Xi_).super_RectMatrix<double,_6U,_6U>.data_[0] + lVar4 * 2)
    ;
    uVar3 = puVar1[1];
    *(undefined8 *)
     ((long)local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar4) = *puVar1;
    *(undefined8 *)
     ((long)local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar4 + 8) = uVar3;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  SquareMatrix3<double>::inverse(&local_60,&local_188);
  pdVar5 = local_a8;
  pSVar7 = &local_60;
  pdVar8 = pdVar5;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pdVar8 = (pSVar7->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0];
    pSVar7 = (SquareMatrix3<double> *)((long)pSVar7 + ((ulong)bVar11 * -2 + 1) * 8);
    pdVar8 = pdVar8 + (ulong)bVar11 * -2 + 1;
  }
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      pdVar5[lVar6] = -pdVar5[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    lVar4 = lVar4 + 1;
    pdVar5 = pdVar5 + 3;
  } while (lVar4 != 3);
  local_1d8[6] = 0.0;
  local_1d8[7] = 0.0;
  local_1d8[4] = 0.0;
  local_1d8[5] = 0.0;
  local_1d8[2] = 0.0;
  local_1d8[3] = 0.0;
  local_1d8[0] = 0.0;
  local_1d8[1] = 0.0;
  local_1d8[8] = 0.0;
  lVar4 = 0;
  do {
    *(undefined8 *)((long)local_1d8 + lVar4 + 0x10) =
         *(undefined8 *)
          ((long)(this->Xi_).super_RectMatrix<double,_6U,_6U>.data_[0] + lVar4 * 2 + 0x28);
    puVar1 = (undefined8 *)
             ((long)(this->Xi_).super_RectMatrix<double,_6U,_6U>.data_[0] + lVar4 * 2 + 0x18);
    uVar3 = puVar1[1];
    *(undefined8 *)((long)local_1d8 + lVar4) = *puVar1;
    *(undefined8 *)((long)local_1d8 + lVar4 + 8) = uVar3;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  local_138[6] = 0.0;
  local_138[7] = 0.0;
  local_138[4] = 0.0;
  local_138[5] = 0.0;
  local_138[2] = 0.0;
  local_138[3] = 0.0;
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[8] = 0.0;
  pdVar5 = local_a8;
  lVar4 = 0;
  do {
    lVar6 = 0;
    pdVar8 = local_1d8;
    do {
      dVar2 = local_138[lVar4 * 3 + lVar6];
      lVar10 = 0;
      pdVar9 = pdVar8;
      do {
        dVar2 = dVar2 + pdVar5[lVar10] * *pdVar9;
        lVar10 = lVar10 + 1;
        pdVar9 = pdVar9 + 3;
      } while (lVar10 != 3);
      local_138[lVar4 * 3 + lVar6] = dVar2;
      lVar6 = lVar6 + 1;
      pdVar8 = pdVar8 + 1;
    } while (lVar6 != 3);
    lVar4 = lVar4 + 1;
    pdVar5 = pdVar5 + 3;
  } while (lVar4 != 3);
  lVar4 = 0;
  do {
    *(undefined8 *)((long)local_138 + lVar4 + 0x58) =
         *(undefined8 *)((long)local_138 + lVar4 + 0x10);
    *(undefined8 *)((long)local_138 + lVar4 + 0x48) = *(undefined8 *)((long)local_138 + lVar4);
    *(undefined8 *)((long)local_138 + lVar4 + 0x50) = *(undefined8 *)((long)local_138 + lVar4 + 8);
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  lVar4 = 0;
  do {
    *(undefined8 *)
     ((long)(__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
            .data_[0] + lVar4 + 0x10) = *(undefined8 *)((long)local_138 + lVar4 + 0x58);
    uVar3 = *(undefined8 *)((long)local_138 + lVar4 + 0x50);
    puVar1 = (undefined8 *)
             ((long)(__return_storage_ptr__->super_SquareMatrix<double,_3>).
                    super_RectMatrix<double,_3U,_3U>.data_[0] + lVar4);
    *puVar1 = *(undefined8 *)((long)local_138 + lVar4 + 0x48);
    puVar1[1] = uVar3;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  return __return_storage_ptr__;
}

Assistant:

Mat3x3d HydroProp::getPitchMatrix() {
    Mat3x3d P;
    P = -getXitt().inverse() * getXirt();
    return P;
  }